

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpixellayout.cpp
# Opt level: O3

QRgbaFloat32 *
fetchRGBToRGB32F<(QImage::Format)11>
          (QRgbaFloat32 *buffer,uchar *src,int index,int count,QList<unsigned_int> *param_5,
          QDitherInfo *param_6)

{
  ushort uVar1;
  long lVar2;
  
  if (0 < count) {
    lVar2 = 0;
    do {
      uVar1 = *(ushort *)(src + lVar2 + (long)index * 2);
      *(ulong *)(&buffer->r + lVar2 * 2) =
           CONCAT44((float)((uVar1 & 0x3e0) * 0x40 + (uVar1 & 0x380) * 2 >> 8) * 0.003921569,
                    (float)(((uVar1 & 0x7000) << 4 | (uVar1 & 0x7c00) << 9) >> 0x10) * 0.003921569);
      *(ulong *)(&buffer->r + lVar2 * 2 + 2) =
           CONCAT44(0x3f800000,(float)((uVar1 >> 2 & 7) + (uint)uVar1 * 8 & 0xff) * 0.003921569);
      lVar2 = lVar2 + 2;
    } while ((ulong)(uint)count * 2 != lVar2);
  }
  return buffer;
}

Assistant:

static const QRgbaFloat32 *QT_FASTCALL fetchRGBToRGB32F(QRgbaFloat32 *buffer, const uchar *src, int index, int count,
                                                    const QList<QRgb> *, QDitherInfo *)
{
    for (int i = 0; i < count; ++i)
        buffer[i] = convertPixelToRGB32F<Format>(fetchPixel<bitsPerPixel<Format>()>(src, index + i));
    return buffer;
}